

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  mz_zip_internal_state *pmVar5;
  bool bVar6;
  uint uVar7;
  mz_bool mVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  int *piVar13;
  uint uVar14;
  int *piVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  mz_uint64 mVar23;
  short *psVar24;
  char cVar25;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  int local_10a8;
  int local_1098;
  ulong local_1094;
  uint local_1088;
  uint local_1084;
  uint local_1080;
  int local_107c;
  mz_uint32 local_1078;
  int local_1074;
  uint local_1070;
  int local_106c;
  ulong local_1068;
  int local_1058 [2];
  ulong local_1050;
  int local_1048;
  int local_1038;
  ushort local_1034;
  ushort local_1032;
  ushort local_1030;
  ushort local_102e;
  uint local_102c;
  uint local_1028;
  
  uVar22 = pZip->m_archive_size;
  if (uVar22 < 0x16) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
      return 0;
    }
    return 0;
  }
  mVar23 = 0;
  if (0x1000 < (long)uVar22) {
    mVar23 = uVar22 - 0x1000;
  }
  do {
    uVar22 = pZip->m_archive_size - mVar23;
    sVar11 = 0x1000;
    if (uVar22 < 0x1000) {
      sVar11 = uVar22;
    }
    sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar23,&local_1038,sVar11);
    cVar25 = '\x01';
    if (sVar9 == sVar11) {
      if (3 < uVar22) {
        uVar22 = (ulong)((int)sVar11 - 4);
        piVar13 = (int *)((long)&local_1038 + uVar22);
        lVar10 = -(uVar22 + mVar23);
        iVar19 = (int)sVar11 + -3;
        do {
          if ((*piVar13 == 0x6054b50) && (0x15 < pZip->m_archive_size + lVar10)) {
            cVar25 = '\x02';
            mVar23 = -lVar10;
            goto LAB_00106d98;
          }
          piVar13 = (int *)((long)piVar13 + -1);
          lVar10 = lVar10 + 1;
          iVar18 = iVar19 + -1;
          bVar6 = 0 < iVar19;
          iVar19 = iVar18;
        } while (iVar18 != 0 && bVar6);
      }
      if (mVar23 != 0) {
        cVar25 = 0x10014 < pZip->m_archive_size - mVar23;
        if (!(bool)cVar25) {
          mVar23 = mVar23 - 0xffd;
        }
      }
    }
LAB_00106d98:
  } while (cVar25 == '\0');
  if (cVar25 != '\x02') {
    pZip->m_last_error = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
    return 0;
  }
  sVar11 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar23,&local_1038,0x16);
  if (sVar11 == 0x16) {
    if (local_1038 != 0x6054b50) {
LAB_00106e2b:
      pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
      return 0;
    }
    if (((0x4b < (long)mVar23) &&
        (sVar11 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar23 - 0x14,local_1058,0x14), sVar11 == 0x14
        )) && (local_1058[0] == 0x7064b50)) {
      if (pZip->m_archive_size - 0x38 < local_1050) goto LAB_00106e2b;
      sVar11 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_1050,&local_1098,0x38);
      if ((sVar11 == 0x38) && (local_1098 == 0x6064b50)) {
        pZip->m_pState->m_zip64 = 1;
      }
    }
    pZip->m_total_files = (uint)local_102e;
    uVar21 = (uint)local_1034;
    uVar7 = (uint)local_1032;
    uVar22 = (ulong)local_1028;
    pmVar5 = pZip->m_pState;
    uVar17 = local_102c;
    uVar16 = (uint)local_1030;
    if (pmVar5->m_zip64 != 0) {
      if (local_1094 < 0x2c) {
        pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
LAB_00106ef4:
        bVar6 = false;
        local_1068 = uVar22;
        local_1080 = (uint)local_1030;
        local_1084 = uVar7;
      }
      else {
        if (local_1048 != 1) {
          pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
          goto LAB_00106ef4;
        }
        if ((local_1074 != 0) || (pZip->m_total_files = local_1078, local_107c != 0)) {
          pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
          goto LAB_00106ef4;
        }
        if (local_106c == 0) {
          bVar6 = true;
          uVar17 = local_1070;
          uVar21 = local_1088;
        }
        else {
          pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
          bVar6 = false;
          local_1068 = uVar22;
          local_1084 = uVar7;
        }
      }
      uVar22 = local_1068;
      uVar16 = local_1080;
      uVar7 = local_1084;
      if (!bVar6) {
        return 0;
      }
    }
    uVar14 = pZip->m_total_files;
    if ((uVar14 != uVar16) || ((uVar21 != 0 || uVar7 != 0 && ((uVar21 != 1 || (uVar7 != 1)))))) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
      return 0;
    }
    if ((uVar17 < uVar14 * 0x2e) || (uVar20 = (ulong)uVar17, pZip->m_archive_size < uVar22 + uVar20)
       ) {
      pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
      return 0;
    }
    pZip->m_central_directory_file_ofs = uVar22;
    if (uVar14 == 0) {
LAB_00107211:
      if ((flags >> 0xb & 1) == 0) {
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);
        return 1;
      }
      return 1;
    }
    if ((uVar20 <= (pmVar5->m_central_dir).m_capacity) ||
       (mVar8 = mz_zip_array_ensure_capacity(pZip,&pmVar5->m_central_dir,uVar20,0), mVar8 != 0)) {
      (pmVar5->m_central_dir).m_size = uVar20;
      pmVar5 = pZip->m_pState;
      uVar12 = (ulong)pZip->m_total_files;
      if ((uVar12 <= (pmVar5->m_central_dir_offsets).m_capacity) ||
         (mVar8 = mz_zip_array_ensure_capacity(pZip,&pmVar5->m_central_dir_offsets,uVar12,0),
         mVar8 != 0)) {
        (pmVar5->m_central_dir_offsets).m_size = uVar12;
        if ((flags >> 0xb & 1) == 0) {
          pmVar5 = pZip->m_pState;
          uVar12 = (ulong)pZip->m_total_files;
          if (((pmVar5->m_sorted_central_dir_offsets).m_capacity < uVar12) &&
             (mVar8 = mz_zip_array_ensure_capacity
                                (pZip,&pmVar5->m_sorted_central_dir_offsets,uVar12,0), mVar8 == 0))
          {
            pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
            return 0;
          }
          (pmVar5->m_sorted_central_dir_offsets).m_size = uVar12;
        }
        sVar11 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar22,(pZip->m_pState->m_central_dir).m_p,
                                  uVar20);
        if (sVar11 == uVar20) {
          if (pZip->m_total_files != 0) {
            pmVar5 = pZip->m_pState;
            piVar13 = (int *)(pmVar5->m_central_dir).m_p;
            uVar22 = 0;
            piVar15 = piVar13;
            do {
              if ((uVar17 < 0x2e) || (*piVar15 != 0x2014b50)) {
LAB_00107123:
                pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
LAB_0010712a:
                bVar6 = false;
              }
              else {
                local_10a8 = (int)piVar13;
                *(int *)((long)(pmVar5->m_central_dir_offsets).m_p + uVar22 * 4) =
                     (int)piVar15 - local_10a8;
                if ((flags >> 0xb & 1) == 0) {
                  *(int *)((long)(pmVar5->m_sorted_central_dir_offsets).m_p + uVar22 * 4) =
                       (int)uVar22;
                }
                uVar16 = piVar15[5];
                uVar7 = piVar15[6];
                uVar2 = *(ushort *)(piVar15 + 7);
                uVar3 = *(ushort *)((long)piVar15 + 0x1e);
                if ((pmVar5->m_zip64_has_extended_info_fields == 0) && (uVar3 != 0)) {
                  uVar14 = uVar7;
                  if (uVar7 < uVar16) {
                    uVar14 = uVar16;
                  }
                  if (uVar14 <= *(uint *)((long)piVar15 + 0x2a)) {
                    uVar14 = *(uint *)((long)piVar15 + 0x2a);
                  }
                  if (uVar14 == 0xffffffff) {
                    psVar24 = (short *)((long)piVar15 + (ulong)uVar2 + 0x2e);
                    uVar14 = (uint)uVar3;
                    do {
                      if (uVar14 < 4) {
LAB_0010716a:
                        pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                        iVar19 = 1;
LAB_00107177:
                        bVar6 = false;
                      }
                      else {
                        puVar1 = (ushort *)(psVar24 + 1);
                        uVar20 = (ulong)*puVar1 + 4;
                        if (uVar14 < uVar20) goto LAB_0010716a;
                        if (*psVar24 == 1) {
                          pmVar5->m_zip64 = 1;
                          pmVar5->m_zip64_has_extended_info_fields = 1;
                          iVar19 = 5;
                          goto LAB_00107177;
                        }
                        psVar24 = (short *)((long)psVar24 + uVar20);
                        uVar14 = (uVar14 - 4) - (uint)*puVar1;
                        iVar19 = 0;
                        bVar6 = true;
                      }
                      if (iVar19 != 0) {
                        if ((iVar19 != 5) && (!bVar6)) goto LAB_0010712a;
                        break;
                      }
                    } while (uVar14 != 0);
                  }
                }
                if ((uVar7 != 0xffffffff && uVar16 != 0xffffffff) &&
                   ((uVar7 != uVar16 && *(int *)((long)piVar15 + 10) == 0 ||
                    (uVar16 == 0 && uVar7 != 0)))) goto LAB_00107123;
                uVar4 = *(ushort *)((long)piVar15 + 0x22);
                if ((uVar4 == 0xffff) || ((uVar4 != 1 && (uVar21 != uVar4)))) {
                  pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
                  goto LAB_0010712a;
                }
                if ((uVar16 != 0xffffffff) &&
                   (pZip->m_archive_size <
                    (ulong)*(uint *)((long)piVar15 + 0x2a) + (ulong)uVar16 + 0x1e))
                goto LAB_00107123;
                if ((*(byte *)((long)piVar15 + 9) & 0x20) != 0) {
                  pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
                  goto LAB_0010712a;
                }
                uVar16 = (uint)uVar2 + (uint)uVar3 + (uint)*(ushort *)(piVar15 + 8) + 0x2e;
                if (uVar17 < uVar16) goto LAB_00107123;
                piVar15 = (int *)((long)piVar15 + (ulong)uVar16);
                bVar6 = true;
                uVar17 = uVar17 - uVar16;
              }
              if (!bVar6) {
                return 0;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < pZip->m_total_files);
          }
          goto LAB_00107211;
        }
        goto LAB_001071f2;
      }
    }
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  }
  else {
LAB_001071f2:
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint flags)
{
    mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0, cdir_disk_index = 0;
    mz_uint64 cdir_ofs = 0;
    mz_int64 cur_file_ofs = 0;
    const mz_uint8 *p;

    mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
    mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
    mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
    mz_uint32 zip64_end_of_central_dir_locator_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

    mz_uint32 zip64_end_of_central_dir_header_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_end_of_central_dir = (mz_uint8 *)zip64_end_of_central_dir_header_u32;

    mz_uint64 zip64_end_of_central_dir_ofs = 0;

    /* Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there. */
    if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_locate_header_sig(pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
        return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

    /* Read and verify the end of central directory record. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE, pZip64_locator, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
        {
            if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG)
            {
                zip64_end_of_central_dir_ofs = MZ_READ_LE64(pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);
                if (zip64_end_of_central_dir_ofs > (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
                    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

                if (pZip->m_pRead(pZip->m_pIO_opaque, zip64_end_of_central_dir_ofs, pZip64_end_of_central_dir, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
                {
                    if (MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG)
                    {
                        pZip->m_pState->m_zip64 = MZ_TRUE;
                    }
                }
            }
        }
    }

    pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    cdir_entries_on_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
    cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
    cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
    cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

    if (pZip->m_pState->m_zip64)
    {
        mz_uint32 zip64_total_num_of_disks = MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
        mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
        mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
        mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
        mz_uint64 zip64_size_of_central_directory = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

        if (zip64_size_of_end_of_central_dir_record < (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (zip64_total_num_of_disks != 1U)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

        /* Check for miniz's practical limits */
        if (zip64_cdir_total_entries > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

        if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        cdir_entries_on_this_disk = (mz_uint32)zip64_cdir_total_entries_on_this_disk;

        /* Check for miniz's current practical limits (sorry, this should be enough for millions of files) */
        if (zip64_size_of_central_directory > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

        cdir_size = (mz_uint32)zip64_size_of_central_directory;

        num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

        cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

        cdir_ofs = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
    }

    if (pZip->m_total_files != cdir_entries_on_this_disk)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (cdir_size < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    pZip->m_central_directory_file_ofs = cdir_ofs;

    if (pZip->m_total_files)
    {
        mz_uint i, n;
        /* Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and possibly another to hold the sorted indices. */
        if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
            (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (sort_central_dir)
        {
            if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

        /* Now create an index into the central directory file records, do some basic sanity checking on each record */
        p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
        for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
        {
            mz_uint total_header_size, disk_index, bit_flags, filename_size, ext_data_size;
            mz_uint64 comp_size, decomp_size, local_header_ofs;

            if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

            if (sort_central_dir)
                MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;

            comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
            decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
            local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
            filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
            ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

            if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
                (ext_data_size) &&
                (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) == MZ_UINT32_MAX))
            {
                /* Attempt to find zip64 extended information field in the entry's extra data */
                mz_uint32 extra_size_remaining = ext_data_size;

                if (extra_size_remaining)
                {
                    const mz_uint8 *pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;

                    do
                    {
                        mz_uint32 field_id;
                        mz_uint32 field_data_size;

                        if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        field_id = MZ_READ_LE16(pExtra_data);
                        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                        if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                        {
                            /* Ok, the archive didn't have any zip64 headers but it uses a zip64 extended information field so mark it as zip64 anyway (this can occur with infozip's zip util when it reads compresses files from stdin). */
                            pZip->m_pState->m_zip64 = MZ_TRUE;
                            pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
                            break;
                        }

                        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                        extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
                    } while (extra_size_remaining);
                }
            }

            /* I've seen archives that aren't marked as zip64 that uses zip64 ext data, argh */
            if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX))
            {
                if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
            if ((disk_index == MZ_UINT16_MAX) || ((disk_index != num_this_disk) && (disk_index != 1)))
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

            if (comp_size != MZ_UINT32_MAX)
            {
                if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
            if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

            if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            n -= total_header_size;
            p += total_header_size;
        }
    }

    if (sort_central_dir)
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

    return MZ_TRUE;
}